

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subprocess_test.cc
# Opt level: O2

void __thiscall SubprocessTestBadCommandStderr::Run(SubprocessTestBadCommandStderr *this)

{
  Test *pTVar1;
  bool bVar2;
  ExitStatus EVar3;
  Subprocess *this_00;
  string *__rhs;
  SubprocessSet *this_01;
  allocator<char> local_41;
  string local_40;
  
  this_01 = &(this->super_SubprocessTest).subprocs_;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,"cmd /c ninja_no_such_command",&local_41);
  this_00 = SubprocessSet::Add(this_01,&local_40,false);
  std::__cxx11::string::~string((string *)&local_40);
  bVar2 = testing::Test::Check
                    (g_current_test,this_00 != (Subprocess *)0x0,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/subprocess_test.cc"
                     ,0x2e,"(Subprocess *) 0 != subproc");
  if (bVar2) {
    while( true ) {
      bVar2 = Subprocess::Done(this_00);
      pTVar1 = g_current_test;
      if (bVar2) break;
      SubprocessSet::DoWork(this_01);
    }
    EVar3 = Subprocess::Finish(this_00);
    testing::Test::Check
              (pTVar1,EVar3 == ExitFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/subprocess_test.cc"
               ,0x35,"ExitFailure == subproc->Finish()");
    pTVar1 = g_current_test;
    __rhs = Subprocess::GetOutput_abi_cxx11_(this_00);
    bVar2 = std::operator!=("",__rhs);
    testing::Test::Check
              (pTVar1,bVar2,
               "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/subprocess_test.cc"
               ,0x36,"\"\" != subproc->GetOutput()");
  }
  else {
    g_current_test->assertion_failures_ = g_current_test->assertion_failures_ + 1;
  }
  return;
}

Assistant:

TEST_F(SubprocessTest, BadCommandStderr) {
  Subprocess* subproc = subprocs_.Add("cmd /c ninja_no_such_command");
  ASSERT_NE((Subprocess *) 0, subproc);

  while (!subproc->Done()) {
    // Pretend we discovered that stderr was ready for writing.
    subprocs_.DoWork();
  }

  EXPECT_EQ(ExitFailure, subproc->Finish());
  EXPECT_NE("", subproc->GetOutput());
}